

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall
doctest::detail::stringifyBinaryExpr<cinatra::content_encoding,cinatra::content_encoding>
          (String *__return_storage_ptr__,detail *this,content_encoding *lhs,char *op,
          content_encoding *rhs)

{
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  toString<cinatra::content_encoding,_true>(&local_48,(content_encoding *)this);
  String::String(&local_60,(char *)lhs);
  operator+(&local_30,&local_48,&local_60);
  toString<cinatra::content_encoding,_true>(&SStack_78,(content_encoding *)op);
  operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                                   const DOCTEST_REF_WRAP(R) rhs) {
            // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
            return toString(lhs) + op + toString(rhs);
        }